

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestPackage.cpp
# Opt level: O0

void __thiscall tcu::TestPackageRegistry::~TestPackageRegistry(TestPackageRegistry *this)

{
  PackageInfo *this_00;
  size_type sVar1;
  reference ppPVar2;
  undefined4 local_14;
  int i;
  TestPackageRegistry *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::
            vector<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
            ::size(&this->m_packageInfos);
    if ((int)sVar1 <= local_14) break;
    ppPVar2 = std::
              vector<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
              ::operator[](&this->m_packageInfos,(long)local_14);
    this_00 = *ppPVar2;
    if (this_00 != (PackageInfo *)0x0) {
      PackageInfo::~PackageInfo(this_00);
      operator_delete(this_00,0x28);
    }
    local_14 = local_14 + 1;
  }
  std::
  vector<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
  ::~vector(&this->m_packageInfos);
  return;
}

Assistant:

TestPackageRegistry::~TestPackageRegistry (void)
{
	for (int i = 0; i < (int)m_packageInfos.size(); i++)
		delete m_packageInfos[i];
}